

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strstr_s.c
# Opt level: O0

errno_t strstr_s(char *dest,rsize_t dmax,char *src,rsize_t slen,char **substring)

{
  long lVar1;
  code *pcVar2;
  ulong uVar3;
  ulong in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  bool bVar4;
  int i;
  rsize_t dlen;
  rsize_t len;
  errno_t in_stack_ffffffffffffffac;
  undefined2 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 in_stack_ffffffffffffffb3;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar5;
  char *in_stack_ffffffffffffffb8;
  ulong local_40;
  ulong local_20;
  char *local_18;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8 == (undefined8 *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffb8,
               (void *)CONCAT44(in_stack_ffffffffffffffb4,
                                CONCAT13(in_stack_ffffffffffffffb3,
                                         CONCAT12(in_stack_ffffffffffffffb2,
                                                  in_stack_ffffffffffffffb0))),
               in_stack_ffffffffffffffac);
    local_c = 400;
  }
  else {
    *in_R8 = 0;
    if (in_RDI == (char *)0x0) {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffb8,
                 (void *)CONCAT44(in_stack_ffffffffffffffb4,
                                  CONCAT13(in_stack_ffffffffffffffb3,
                                           CONCAT12(in_stack_ffffffffffffffb2,
                                                    in_stack_ffffffffffffffb0))),
                 in_stack_ffffffffffffffac);
      local_c = 400;
    }
    else if (in_RSI == 0) {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffb8,
                 (void *)CONCAT44(in_stack_ffffffffffffffb4,
                                  CONCAT13(in_stack_ffffffffffffffb3,
                                           CONCAT12(in_stack_ffffffffffffffb2,
                                                    in_stack_ffffffffffffffb0))),
                 in_stack_ffffffffffffffac);
      local_c = 0x191;
    }
    else if (in_RSI < 0x10000001) {
      if (in_RDX == (char *)0x0) {
        invoke_safe_str_constraint_handler
                  (in_stack_ffffffffffffffb8,
                   (void *)CONCAT44(in_stack_ffffffffffffffb4,
                                    CONCAT13(in_stack_ffffffffffffffb3,
                                             CONCAT12(in_stack_ffffffffffffffb2,
                                                      in_stack_ffffffffffffffb0))),
                   in_stack_ffffffffffffffac);
        local_c = 400;
      }
      else if (in_RCX == 0) {
        invoke_safe_str_constraint_handler
                  (in_stack_ffffffffffffffb8,
                   (void *)CONCAT44(in_stack_ffffffffffffffb4,
                                    CONCAT13(in_stack_ffffffffffffffb3,
                                             CONCAT12(in_stack_ffffffffffffffb2,
                                                      in_stack_ffffffffffffffb0))),
                   in_stack_ffffffffffffffac);
        local_c = 0x191;
      }
      else if (in_RCX < 0x10000001) {
        if ((*in_RDX == '\0') || (local_20 = in_RSI, local_18 = in_RDI, in_RDI == in_RDX)) {
          *in_R8 = in_RDI;
          local_c = 0;
        }
        else {
          while( true ) {
            bVar4 = false;
            if (local_20 != 0) {
              bVar4 = *local_18 != '\0';
            }
            if (!bVar4) break;
            iVar5 = 0;
            uVar3 = local_20;
            local_40 = in_RCX;
            while ((in_RDX[iVar5] != '\0' && uVar3 != 0 && (local_18[iVar5] == in_RDX[iVar5]))) {
              bVar4 = SCARRY4(iVar5,1);
              iVar5 = iVar5 + 1;
              if (bVar4) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              local_40 = local_40 - 1;
              uVar3 = uVar3 - 1;
              if ((in_RDX[iVar5] == '\0') || (local_40 == 0)) {
                *in_R8 = local_18;
                local_c = 0;
                goto LAB_0010ccdd;
              }
            }
            local_18 = local_18 + 1;
            local_20 = local_20 - 1;
          }
          *in_R8 = 0;
          local_c = 0x199;
        }
      }
      else {
        invoke_safe_str_constraint_handler
                  (in_stack_ffffffffffffffb8,
                   (void *)CONCAT44(in_stack_ffffffffffffffb4,
                                    CONCAT13(in_stack_ffffffffffffffb3,
                                             CONCAT12(in_stack_ffffffffffffffb2,
                                                      in_stack_ffffffffffffffb0))),
                   in_stack_ffffffffffffffac);
        local_c = 0x193;
      }
    }
    else {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffb8,
                 (void *)CONCAT44(in_stack_ffffffffffffffb4,
                                  CONCAT13(in_stack_ffffffffffffffb3,
                                           CONCAT12(in_stack_ffffffffffffffb2,
                                                    in_stack_ffffffffffffffb0))),
                 in_stack_ffffffffffffffac);
      local_c = 0x193;
    }
  }
LAB_0010ccdd:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
strstr_s (char *dest, rsize_t dmax,
          const char *src, rsize_t slen, char **substring)
{
    rsize_t len;
    rsize_t dlen;
    int i;

    if (substring == NULL) {
        invoke_safe_str_constraint_handler("strstr_s: substring is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }
    *substring = NULL;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strstr_s: dest is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strstr_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strstr_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strstr_s: src is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (slen == 0) {
        invoke_safe_str_constraint_handler("strstr_s: slen is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (slen > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strstr_s: slen exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    /*
     * src points to a string with zero length, or
     * src equals dest, return dest
     */
    if (*src == '\0' || dest == src) {
        *substring = dest;
        return RCNEGATE(EOK);
    }

    while (dmax && *dest) {
        i = 0;
        len = slen;
        dlen = dmax;

        while (src[i] && dlen) {

            /* not a match, not a substring */
            if (dest[i] != src[i]) {
                break;
            }

            /* move to the next char */
            i++;
            len--;
            dlen--;

            if (src[i] == '\0' || !len) {
                *substring = dest;
                return RCNEGATE(EOK);
            }
        }
        dest++;
        dmax--;
    }

    /*
     * substring was not found, return NULL
     */
    *substring = NULL;
    return RCNEGATE(ESNOTFND);
}